

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHelper.h
# Opt level: O2

void __thiscall
FIX::ExeceptionStore::get
          (ExeceptionStore *this,SEQNUM param_1,SEQNUM param_2,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *param_3)

{
  IOException *this_00;
  allocator<char> local_39;
  string local_38;
  
  this_00 = (IOException *)__cxa_allocate_exception(0x50);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"get threw an IOException",&local_39);
  IOException::IOException(this_00,&local_38);
  __cxa_throw(this_00,&IOException::typeinfo,Exception::~Exception);
}

Assistant:

EXCEPT(IOException) {
    throw IOException("get threw an IOException");
  }